

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

int64_t hdr_value_at_percentile(hdr_histogram *h,double percentile)

{
  int64_t value;
  double local_40;
  int64_t value_from_idx;
  int64_t count_at_percentile;
  double requested_percentile;
  double percentile_local;
  hdr_histogram *h_local;
  
  local_40 = percentile;
  if (100.0 <= percentile) {
    local_40 = 100.0;
  }
  value = get_value_from_idx_up_to_count
                    (h,(long)((local_40 / 100.0) * (double)h->total_count + 0.5));
  if ((percentile != 0.0) || (NAN(percentile))) {
    h_local = (hdr_histogram *)highest_equivalent_value(h,value);
  }
  else {
    h_local = (hdr_histogram *)lowest_equivalent_value(h,value);
  }
  return (int64_t)h_local;
}

Assistant:

int64_t hdr_value_at_percentile(const struct hdr_histogram* h, double percentile)
{
    double requested_percentile = percentile < 100.0 ? percentile : 100.0;
    int64_t count_at_percentile =
        (int64_t) (((requested_percentile / 100) * h->total_count) + 0.5);
    int64_t value_from_idx = get_value_from_idx_up_to_count(h, count_at_percentile);
    if (percentile == 0.0)
    {
        return lowest_equivalent_value(h, value_from_idx);
    }
    return highest_equivalent_value(h, value_from_idx);
}